

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_ubjson_value(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                   *this,char_int_type prefix)

{
  bool bVar1;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *this_00;
  int in_ESI;
  long in_RDI;
  double dVar2;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_00000008;
  string last_token_1;
  string_t s_1;
  string_t s;
  string last_token;
  double number_6;
  float number_5;
  int64_t number_4;
  int32_t number_3;
  int16_t number_2;
  int8_t number_1;
  uint8_t number;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffcf0;
  allocator<char> *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  char __c;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffd08;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  input_format_t iVar5;
  undefined8 uVar4;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  allocator<char> *in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2a;
  undefined1 in_stack_fffffffffffffd2b;
  undefined4 in_stack_fffffffffffffd2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffd48;
  byte local_272;
  string *in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaa;
  undefined1 in_stack_fffffffffffffdab;
  undefined1 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdad;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [23];
  undefined1 in_stack_fffffffffffffdff;
  string_t *in_stack_fffffffffffffe00;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe08;
  input_format_t in_stack_fffffffffffffe14;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe18;
  undefined1 local_1d8 [16];
  string *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  string local_1b0 [32];
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [40];
  string local_b8 [37];
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  string local_90 [32];
  undefined8 local_70;
  byte local_65;
  byte local_52;
  allocator<char> local_51;
  string local_50 [36];
  float local_2c;
  undefined8 local_28;
  int local_1c;
  short local_18;
  char local_16;
  undefined1 local_15;
  byte local_1;
  
  __c = (char)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  this_00 = (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
             *)(ulong)(in_ESI + 1);
  iVar5 = (input_format_t)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  switch(this_00) {
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x0:
    local_1 = unexpect_eof(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                           (char *)in_stack_fffffffffffffe08);
    break;
  default:
    get_token_string((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                      *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    uVar4 = *(undefined8 *)(in_RDI + 0x18);
    plVar3 = *(long **)(in_RDI + 0x28);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   in_stack_fffffffffffffd30);
    iVar5 = (input_format_t)((ulong)in_RDI >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,
               (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                CONCAT13(in_stack_fffffffffffffd2b,
                                         CONCAT12(in_stack_fffffffffffffd2a,
                                                  in_stack_fffffffffffffd28))),
               in_stack_fffffffffffffd20);
    exception_message(this_00,iVar5,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffdaf,
                               CONCAT16(in_stack_fffffffffffffdae,
                                        CONCAT15(in_stack_fffffffffffffdad,
                                                 CONCAT14(in_stack_fffffffffffffdac,
                                                          CONCAT13(in_stack_fffffffffffffdab,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffdaa,
                                                  in_stack_fffffffffffffda8)))))),
                      in_stack_fffffffffffffda0);
    parse_error::create(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,
                        in_stack_fffffffffffffe38);
    local_1 = (**(code **)(*plVar3 + 0x60))(plVar3,uVar4,local_1b0,local_1d8);
    local_1 = local_1 & 1;
    parse_error::~parse_error((parse_error *)0x11ac4e);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_1b0);
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x44:
    get(in_stack_fffffffffffffcf0);
    bVar1 = unexpect_eof(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                         (char *)in_stack_fffffffffffffe08);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (*(int *)(in_RDI + 0x10) < 0x80) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08,__c,
                   in_stack_fffffffffffffcf8);
        std::allocator<char>::~allocator(&local_169);
        local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                            (*(long **)(in_RDI + 0x28),local_168);
        local_1 = local_1 & 1;
        std::__cxx11::string::~string(local_168);
      }
      else {
        get_token_string((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                          *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
        uVar4 = *(undefined8 *)(in_RDI + 0x18);
        plVar3 = *(long **)(in_RDI + 0x28);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                       in_stack_fffffffffffffd30);
        iVar5 = (input_format_t)((ulong)in_RDI >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd30,
                   (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                    CONCAT13(in_stack_fffffffffffffd2b,
                                             CONCAT12(in_stack_fffffffffffffd2a,
                                                      in_stack_fffffffffffffd28))),
                   in_stack_fffffffffffffd20);
        exception_message(this_00,iVar5,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,
                                            CONCAT15(in_stack_fffffffffffffdad,
                                                     CONCAT14(in_stack_fffffffffffffdac,
                                                              CONCAT13(in_stack_fffffffffffffdab,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffdaa,
                                                  in_stack_fffffffffffffda8)))))),
                          in_stack_fffffffffffffda0);
        parse_error::create(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,
                            in_stack_fffffffffffffe38);
        local_1 = (**(code **)(*plVar3 + 0x60))(plVar3,uVar4,local_b8,local_e0);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x11a873);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator(&local_141);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_b8);
      }
    }
    else {
      local_1 = 0;
    }
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x45:
    local_70 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<double,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(double *)in_stack_fffffffffffffd08);
    uVar4 = local_70;
    local_92 = 0;
    local_93 = 0;
    local_272 = 0;
    if (bVar1) {
      plVar3 = *(long **)(in_RDI + 0x28);
      std::allocator<char>::allocator();
      local_92 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,
                 (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                  CONCAT13(in_stack_fffffffffffffd2b,
                                           CONCAT12(in_stack_fffffffffffffd2a,
                                                    in_stack_fffffffffffffd28))),
                 in_stack_fffffffffffffd20);
      local_93 = 1;
      local_272 = (**(code **)(*plVar3 + 0x20))(uVar4,plVar3,local_90);
    }
    local_1 = local_272 & 1;
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator(&local_91);
    }
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x47:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),0);
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x49:
    local_1 = get_ubjson_high_precision_number(in_stack_00000008);
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x4a:
    local_18 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<short,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(short *)in_stack_fffffffffffffd08);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                          (*(long **)(in_RDI + 0x28),(long)local_18);
    }
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x4d:
    local_28 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<long,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(long *)in_stack_fffffffffffffd08);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),local_28)
      ;
    }
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x54:
    std::__cxx11::string::string(local_190);
    bVar1 = get_ubjson_string(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                              (bool)in_stack_fffffffffffffdff);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                          (*(long **)(in_RDI + 0x28),local_190);
    }
    local_1 = local_1 & 1;
    std::__cxx11::string::~string(local_190);
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x55:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),1);
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x56:
    local_15 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(uchar *)in_stack_fffffffffffffd08);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),local_15)
      ;
    }
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x5b:
    local_1 = (**(code **)**(undefined8 **)(in_RDI + 0x28))();
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x5c:
    local_1 = get_ubjson_array(in_stack_fffffffffffffd08);
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x65:
    local_2c = 0.0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<float,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(float *)in_stack_fffffffffffffd08);
    local_52 = 0;
    local_65 = 0;
    local_1 = 0;
    if (bVar1) {
      plVar3 = *(long **)(in_RDI + 0x28);
      dVar2 = (double)local_2c;
      std::allocator<char>::allocator();
      local_52 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,
                 (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                  CONCAT13(in_stack_fffffffffffffd2b,
                                           CONCAT12(in_stack_fffffffffffffd2a,
                                                    in_stack_fffffffffffffd28))),
                 in_stack_fffffffffffffd20);
      local_65 = 1;
      local_1 = (**(code **)(*plVar3 + 0x20))(dVar2,plVar3,local_50);
    }
    local_1 = local_1 & 1;
    if ((local_65 & 1) != 0) {
      std::__cxx11::string::~string(local_50);
    }
    if ((local_52 & 1) != 0) {
      std::allocator<char>::~allocator(&local_51);
    }
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x6a:
    local_16 = '\0';
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(char *)in_stack_fffffffffffffd08);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                          (*(long **)(in_RDI + 0x28),(long)local_16);
    }
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x6d:
    local_1c = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<int,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                       iVar5,(int *)in_stack_fffffffffffffd08);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                          (*(long **)(in_RDI + 0x28),(long)local_1c);
    }
    local_1 = local_1 & 1;
    break;
  case (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
        *)0x7c:
    local_1 = get_ubjson_object(in_stack_fffffffffffffd48);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool get_ubjson_value(const char_int_type prefix)
    {
        switch (prefix)
        {
            case std::char_traits<char_type>::eof():  // EOF
                return unexpect_eof(input_format_t::ubjson, "value");

            case 'T':  // true
                return sax->boolean(true);
            case 'F':  // false
                return sax->boolean(false);

            case 'Z':  // null
                return sax->null();

            case 'U':
            {
                std::uint8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_unsigned(number);
            }

            case 'i':
            {
                std::int8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'I':
            {
                std::int16_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'l':
            {
                std::int32_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'L':
            {
                std::int64_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'd':
            {
                float number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'D':
            {
                double number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'H':
            {
                return get_ubjson_high_precision_number();
            }

            case 'C':  // char
            {
                get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "char")))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(current > 127))
                {
                    auto last_token = get_token_string();
                    return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::ubjson, "byte after 'C' must be in range 0x00..0x7F; last byte: 0x" + last_token, "char")));
                }
                string_t s(1, static_cast<typename string_t::value_type>(current));
                return sax->string(s);
            }

            case 'S':  // string
            {
                string_t s;
                return get_ubjson_string(s) && sax->string(s);
            }

            case '[':  // array
                return get_ubjson_array();

            case '{':  // object
                return get_ubjson_object();

            default: // anything else
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "invalid byte: 0x" + last_token, "value")));
            }
        }
    }